

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__COLLADA
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  ParserChar *text;
  bool bVar1;
  byte *pbVar2;
  StringHash SVar3;
  undefined4 uVar4;
  long lVar5;
  xmlChar **ppxVar6;
  StringHashPair SVar7;
  bool failed_1;
  ParserChar *attributeValue;
  bool failed;
  bool local_121;
  ParserChar *local_120;
  URI local_118;
  
  pbVar2 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0xf0);
  *(undefined8 *)pbVar2 = COLLADA__AttributeData::DEFAULT;
  this_00 = (URI *)(pbVar2 + 8);
  COLLADABU::URI::URI(this_00,(URI *)&DAT_009e8378,false);
  *attributeDataPtr = pbVar2;
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    do {
      text = *ppxVar6;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_120 = ppxVar6[1];
        if (SVar3 == 0x7f4353) goto LAB_006a3aa9;
        if (SVar3 == 0x4008f65) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_120,&local_121);
          COLLADABU::URI::operator=(this_00,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_121 == true) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x84105c1,0x4008f65,local_120),
             bVar1)) {
LAB_006a3a53:
            bVar1 = false;
            validationDataPtr = (void **)0x1;
          }
          else {
            validationDataPtr = (void **)0x4;
            bVar1 = true;
            if (local_121 == false) {
              *pbVar2 = *pbVar2 | 1;
            }
          }
LAB_006a3aa4:
          if (bVar1) {
LAB_006a3aa9:
            validationDataPtr = (void **)0x0;
          }
        }
        else {
          if (SVar3 == 0xcc9a02e) {
            SVar3 = GeneratedSaxParser::Utils::calculateStringHash(local_120,(bool *)&local_118);
            lVar5 = 0;
            bVar1 = false;
            do {
              if (*(StringHash *)((long)&ENUM__VersionTypeMap + lVar5) == SVar3) {
                local_118.mUriString._M_dataplus._M_p._0_1_ = '\0';
                validationDataPtr = (void **)(ulong)*(uint *)((long)&DAT_0085e188 + lVar5);
              }
              uVar4 = SUB84(validationDataPtr,0);
              if (*(StringHash *)((long)&ENUM__VersionTypeMap + lVar5) == SVar3) break;
              lVar5 = lVar5 + 0x10;
              bVar1 = lVar5 != 0x10;
            } while (lVar5 == 0x10);
            if (bVar1) {
              local_118.mUriString._M_dataplus._M_p._0_1_ = '\x01';
              uVar4 = 2;
            }
            *(undefined4 *)(pbVar2 + 4) = uVar4;
            if (((char)local_118.mUriString._M_dataplus._M_p == '\x01') &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x84105c1,0xcc9a02e,local_120),
               bVar1)) goto LAB_006a3a53;
            validationDataPtr = (void **)0x4;
            bVar1 = true;
            goto LAB_006a3aa4;
          }
          SVar7 = GeneratedSaxParser::Utils::calculateStringHashWithNamespace(text);
          if (SVar7.first == 0x7f4353) goto LAB_006a3aa9;
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x84105c1,text,local_120);
          validationDataPtr = (void **)0x1;
          if (!bVar1) goto LAB_006a3aa9;
        }
        ppxVar6 = ppxVar6 + 2;
      }
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr != 3) {
      return false;
    }
  }
  if ((*pbVar2 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  if ((*(int *)(pbVar2 + 4) == 3) &&
     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                         ERROR_REQUIRED_ATTRIBUTE_MISSING,0x84105c1,0xcc9a02e,(ParserChar *)0x0),
     bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__COLLADA( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__COLLADA( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

COLLADA__AttributeData* attributeData = newData<COLLADA__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_version:
    {
bool failed;
attributeData->version = Utils::toEnum<ENUM__VersionType, StringHash, ENUM__VersionType__COUNT>(attributeValue, failed, ENUM__VersionTypeMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLLADA,
        HASH_ATTRIBUTE_version,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_base:
    {
bool failed;
attributeData->base = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLLADA,
        HASH_ATTRIBUTE_base,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= COLLADA__AttributeData::ATTRIBUTE_BASE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_xmlns:
    {
    // ignore

    break;
    }
    default:
    {
        StringHashPair hashPair = Utils::calculateStringHashWithNamespace( attribute );
        if ( hashPair.first != HASH_ATTRIBUTE_xmlns )
        {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_COLLADA, attribute, attributeValue))
            {return false;}        }
        else
        {
            // ignore
        }

    }
    }
    }
}
if ((attributeData->present_attributes & COLLADA__AttributeData::ATTRIBUTE_BASE_PRESENT) == 0)
{
    attributeData->base = COLLADABU::URI("");
}
if ( attributeData->version == ENUM__VersionType__NOT_PRESENT )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_COLLADA, HASH_ATTRIBUTE_version, 0 ) )
        return false;
}


    return true;
}